

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O0

void __thiscall
t_json_generator::write_const_value
          (t_json_generator *this,t_const_value *value,bool should_force_string)

{
  pointer *__return_storage_ptr__;
  bool bVar1;
  t_const_value_type tVar2;
  int64_t iVar3;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> *__x;
  reference pptVar4;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *pmVar5;
  pointer ppVar6;
  double dVar7;
  string local_148;
  _Self local_128;
  _Base_ptr local_120;
  _Rb_tree_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_118;
  iterator mit;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  map;
  __normal_iterator<t_const_value_**,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  local_c0;
  t_const_value **local_b8;
  __normal_iterator<t_const_value_**,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  local_b0;
  iterator lit;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> list;
  string local_70;
  string local_40;
  byte local_19;
  t_const_value *ptStack_18;
  bool should_force_string_local;
  t_const_value *value_local;
  t_json_generator *this_local;
  
  local_19 = should_force_string;
  ptStack_18 = value;
  value_local = (t_const_value *)this;
  tVar2 = t_const_value::get_type(value);
  switch(tVar2) {
  case CV_INTEGER:
  case CV_IDENTIFIER:
    if ((local_19 & 1) == 0) {
      iVar3 = t_const_value::get_integer(ptStack_18);
      write_number<long>(this,iVar3);
    }
    else {
      iVar3 = t_const_value::get_integer(ptStack_18);
      number_to_string<long>(&local_40,this,iVar3);
      write_string(this,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    break;
  case CV_DOUBLE:
    if ((local_19 & 1) == 0) {
      dVar7 = t_const_value::get_double(ptStack_18);
      write_number<double>(this,dVar7);
    }
    else {
      dVar7 = t_const_value::get_double(ptStack_18);
      number_to_string<double>(&local_70,this,dVar7);
      write_string(this,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    break;
  case CV_STRING:
    __return_storage_ptr__ =
         &list.super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
    t_const_value::get_string_abi_cxx11_((string *)__return_storage_ptr__,ptStack_18);
    write_string(this,(string *)__return_storage_ptr__);
    std::__cxx11::string::~string
              ((string *)
               &list.super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    break;
  case CV_MAP:
    start_object(this,false);
    pmVar5 = t_const_value::get_map(ptStack_18);
    std::
    map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::map((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
           *)&mit,pmVar5);
    std::_Rb_tree_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::_Rb_tree_iterator
              (&local_118);
    local_120 = (_Base_ptr)
                std::
                map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                ::begin((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                         *)&mit);
    local_118._M_node = local_120;
    while( true ) {
      local_128._M_node =
           (_Base_ptr)
           std::
           map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
           ::end((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                  *)&mit);
      bVar1 = std::operator!=(&local_118,&local_128);
      if (!bVar1) break;
      write_comma_if_needed(this);
      t_generator::indent_abi_cxx11_(&local_148,&this->super_t_generator);
      std::operator<<((ostream *)&this->f_json_,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      ppVar6 = std::_Rb_tree_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::operator->
                         (&local_118);
      write_const_value(this,ppVar6->first,true);
      std::operator<<((ostream *)&this->f_json_,": ");
      ppVar6 = std::_Rb_tree_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::operator->
                         (&local_118);
      write_const_value(this,ppVar6->second,false);
      indicate_comma_needed(this);
      std::_Rb_tree_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::operator++
                (&local_118);
    }
    end_object(this);
    std::
    map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::~map((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
            *)&mit);
    break;
  case CV_LIST:
    start_array(this);
    __x = t_const_value::get_list(ptStack_18);
    std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::vector
              ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)&lit,__x);
    __gnu_cxx::
    __normal_iterator<t_const_value_**,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
    ::__normal_iterator(&local_b0);
    local_b8 = (t_const_value **)
               std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::begin
                         ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)&lit);
    local_b0._M_current = local_b8;
    while( true ) {
      local_c0._M_current =
           (t_const_value **)
           std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::end
                     ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)&lit);
      bVar1 = __gnu_cxx::operator!=(&local_b0,&local_c0);
      if (!bVar1) break;
      write_comma_if_needed(this);
      t_generator::indent_abi_cxx11_
                ((string *)&map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 &this->super_t_generator);
      std::operator<<((ostream *)&this->f_json_,
                      (string *)&map._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&map._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_const_value_**,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                ::operator*(&local_b0);
      write_const_value(this,*pptVar4,false);
      indicate_comma_needed(this);
      __gnu_cxx::
      __normal_iterator<t_const_value_**,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
      ::operator++(&local_b0);
    }
    end_array(this);
    std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::~vector
              ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)&lit);
    break;
  default:
    std::operator<<((ostream *)&this->f_json_,"null");
  }
  return;
}

Assistant:

void t_json_generator::write_const_value(t_const_value* value, bool should_force_string) {

  switch (value->get_type()) {

  case t_const_value::CV_IDENTIFIER:
  case t_const_value::CV_INTEGER:
    if (should_force_string) {
      write_string(number_to_string(value->get_integer()));
    } else {
      write_number(value->get_integer());
    }
    break;

  case t_const_value::CV_DOUBLE:
    if (should_force_string) {
      write_string(number_to_string(value->get_double()));
    } else {
      write_number(value->get_double());
    }
    break;

  case t_const_value::CV_STRING:
    write_string(value->get_string());
    break;

  case t_const_value::CV_LIST: {
    start_array();
    std::vector<t_const_value*> list = value->get_list();
    std::vector<t_const_value*>::iterator lit;
    for (lit = list.begin(); lit != list.end(); ++lit) {
      write_comma_if_needed();
      f_json_ << indent();
      write_const_value(*lit);
      indicate_comma_needed();
    }
    end_array();
    break;
  }

  case t_const_value::CV_MAP: {
    start_object(NO_INDENT);
    std::map<t_const_value*, t_const_value*, t_const_value::value_compare> map = value->get_map();
    std::map<t_const_value*, t_const_value*, t_const_value::value_compare>::iterator mit;
    for (mit = map.begin(); mit != map.end(); ++mit) {
      write_comma_if_needed();
      f_json_ << indent();
      // JSON objects only allow string keys
      write_const_value(mit->first, FORCE_STRING);
      f_json_ << ": ";
      write_const_value(mit->second);
      indicate_comma_needed();
    }
    end_object();
    break;
  }

  default:
    f_json_ << "null";
    break;
  }
}